

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLog::WriteDropMacro(WriteAheadLog *this,ScalarMacroCatalogEntry *entry)

{
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,DROP_MACRO);
  Serializer::WriteProperty<std::__cxx11::string>
            (&serializer.serializer.super_Serializer,0x65,"schema",
             &(((entry->super_MacroCatalogEntry).super_FunctionEntry.super_StandardEntry.schema)->
              super_InCatalogEntry).super_CatalogEntry.name);
  Serializer::WriteProperty<std::__cxx11::string>
            (&serializer.serializer.super_Serializer,0x66,"name",
             &(entry->super_MacroCatalogEntry).super_FunctionEntry.super_StandardEntry.
              super_InCatalogEntry.super_CatalogEntry.name);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteDropMacro(const ScalarMacroCatalogEntry &entry) {
	WriteAheadLogSerializer serializer(*this, WALType::DROP_MACRO);
	serializer.WriteProperty(101, "schema", entry.schema.name);
	serializer.WriteProperty(102, "name", entry.name);
	serializer.End();
}